

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O2

int UTF8ToUTF16LE(uchar *outb,int *outlen,uchar *in,int *inlen)

{
  ushort *puVar1;
  byte bVar2;
  int iVar3;
  uchar *processed;
  int iVar4;
  unsigned_short *out;
  byte *pbVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  byte *pbVar9;
  
  iVar4 = (int)outb;
  if (inlen == (int *)0x0 || (outlen == (int *)0x0 || outb == (uchar *)0x0)) {
    return -1;
  }
  if (in == (uchar *)0x0) {
    *outlen = 0;
    *inlen = 0;
    return 0;
  }
  pbVar5 = in + *inlen;
  puVar1 = (ushort *)(outb + (long)(*outlen / 2) * 2);
  pbVar9 = in;
  while( true ) {
    iVar3 = (int)pbVar9;
    if (pbVar5 <= pbVar9) break;
    bVar2 = *pbVar9;
    uVar8 = (uint)bVar2;
    uVar7 = 0;
    if ((char)bVar2 < '\0') {
      if (bVar2 < 0xc0) {
LAB_0014347b:
        *outlen = (int)outb - iVar4;
        *inlen = iVar3 - (int)in;
        return -2;
      }
      uVar8 = (uint)bVar2;
      if (bVar2 < 0xe0) {
        uVar8 = uVar8 & 0x1f;
        uVar7 = 1;
      }
      else if (bVar2 < 0xf0) {
        uVar8 = uVar8 & 0xf;
        uVar7 = 2;
      }
      else {
        if (0xf7 < bVar2) goto LAB_0014347b;
        uVar8 = uVar8 & 7;
        uVar7 = 3;
      }
    }
    pbVar9 = pbVar9 + 1;
    if ((long)pbVar5 - (long)pbVar9 < (long)uVar7) break;
    while ((iVar6 = (int)uVar7, uVar7 = (ulong)(iVar6 - 1), iVar6 != 0 && (pbVar9 < pbVar5))) {
      bVar2 = *pbVar9;
      pbVar9 = pbVar9 + 1;
      if ((bVar2 & 0xc0) != 0x80) break;
      uVar8 = uVar8 << 6 | bVar2 & 0x3f;
    }
    if (uVar8 < 0x10000) {
      if (puVar1 <= outb) break;
      *(ushort *)outb = (ushort)uVar8;
      outb = (uchar *)((long)outb + 2);
    }
    else {
      if ((0x10ffff < uVar8) || (puVar1 <= (ushort *)((long)outb + 2))) break;
      *(ushort *)outb = (ushort)(uVar8 + 0xff0000 >> 10) | 0xd800;
      *(ushort *)((long)outb + 2) = (ushort)uVar8 & 0x3ff | 0xdc00;
      outb = (uchar *)((long)outb + 4);
    }
  }
  *outlen = (int)outb - iVar4;
  *inlen = iVar3 - (int)in;
  return *outlen;
}

Assistant:

static int
UTF8ToUTF16LE(unsigned char* outb, int *outlen,
            const unsigned char* in, int *inlen)
{
    unsigned short* out = (unsigned short*) outb;
    const unsigned char* processed = in;
    const unsigned char *const instart = in;
    unsigned short* outstart= out;
    unsigned short* outend;
    const unsigned char* inend;
    unsigned int c, d;
    int trailing;
    unsigned char *tmp;
    unsigned short tmp1, tmp2;

    /* UTF16LE encoding has no BOM */
    if ((out == NULL) || (outlen == NULL) || (inlen == NULL)) return(-1);
    if (in == NULL) {
	*outlen = 0;
	*inlen = 0;
	return(0);
    }
    inend= in + *inlen;
    outend = out + (*outlen / 2);
    while (in < inend) {
      d= *in++;
      if      (d < 0x80)  { c= d; trailing= 0; }
      else if (d < 0xC0) {
          /* trailing byte in leading position */
	  *outlen = (out - outstart) * 2;
	  *inlen = processed - instart;
	  return(-2);
      } else if (d < 0xE0)  { c= d & 0x1F; trailing= 1; }
      else if (d < 0xF0)  { c= d & 0x0F; trailing= 2; }
      else if (d < 0xF8)  { c= d & 0x07; trailing= 3; }
      else {
	/* no chance for this in UTF-16 */
	*outlen = (out - outstart) * 2;
	*inlen = processed - instart;
	return(-2);
      }

      if (inend - in < trailing) {
          break;
      }

      for ( ; trailing; trailing--) {
          if ((in >= inend) || (((d= *in++) & 0xC0) != 0x80))
	      break;
          c <<= 6;
          c |= d & 0x3F;
      }

      /* assertion: c is a single UTF-4 value */
        if (c < 0x10000) {
            if (out >= outend)
	        break;
	    if (xmlLittleEndian) {
		*out++ = c;
	    } else {
		tmp = (unsigned char *) out;
		*tmp = c ;
		*(tmp + 1) = c >> 8 ;
		out++;
	    }
        }
        else if (c < 0x110000) {
            if (out+1 >= outend)
	        break;
            c -= 0x10000;
	    if (xmlLittleEndian) {
		*out++ = 0xD800 | (c >> 10);
		*out++ = 0xDC00 | (c & 0x03FF);
	    } else {
		tmp1 = 0xD800 | (c >> 10);
		tmp = (unsigned char *) out;
		*tmp = (unsigned char) tmp1;
		*(tmp + 1) = tmp1 >> 8;
		out++;

		tmp2 = 0xDC00 | (c & 0x03FF);
		tmp = (unsigned char *) out;
		*tmp  = (unsigned char) tmp2;
		*(tmp + 1) = tmp2 >> 8;
		out++;
	    }
        }
        else
	    break;
	processed = in;
    }
    *outlen = (out - outstart) * 2;
    *inlen = processed - instart;
    return(*outlen);
}